

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_model(Net *this,DataReader *dr)

{
  undefined1 uVar2;
  Layer *pLVar1;
  undefined3 uVar3;
  int iVar4;
  pointer ppLVar5;
  ulong uVar6;
  int iVar7;
  Net *this_00;
  bool bVar8;
  ModelBinFromDataReader mb;
  Option opt1;
  ModelBinFromDataReader MStack_68;
  undefined4 local_58;
  int iStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  if ((this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    load_model();
    iVar7 = -1;
  }
  else {
    ModelBinFromDataReader::ModelBinFromDataReader(&MStack_68,dr);
    ppLVar5 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
        super__Vector_impl_data._M_finish == ppLVar5) {
      iVar7 = 0;
    }
    else {
      iVar7 = 0;
      uVar6 = 0;
      do {
        pLVar1 = ppLVar5[uVar6];
        if (pLVar1 == (Layer *)0x0) {
LAB_0012e93e:
          load_model();
          iVar7 = -1;
          bVar8 = false;
        }
        else {
          iVar4 = (*pLVar1->_vptr_Layer[3])(pLVar1,&MStack_68);
          bVar8 = iVar4 == 0;
          if (!bVar8) goto LAB_0012e93e;
        }
        if (!bVar8) break;
        uVar6 = uVar6 + 1;
        ppLVar5 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(this->layers).
                                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar5 >> 3
                              ));
    }
    ppLVar5 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppLVar5) {
      this_00 = (Net *)0x0;
      do {
        pLVar1 = ppLVar5[(long)this_00];
        if (pLVar1 == (Layer *)0x0) {
          load_model(this_00);
          iVar7 = -1;
          bVar8 = false;
        }
        else {
          local_38._0_1_ = (this->opt).use_int8_arithmetic;
          local_38._1_1_ = (this->opt).use_packing_layout;
          local_38._2_1_ = (this->opt).use_shader_pack8;
          local_38._3_1_ = (this->opt).use_image_storage;
          uVar2 = (this->opt).use_bf16_storage;
          uVar3 = *(undefined3 *)&(this->opt).field_0x25;
          local_38._4_4_ = CONCAT31(uVar3,uVar2);
          local_58 = *(undefined4 *)&this->opt;
          iStack_54 = (this->opt).num_threads;
          uStack_50 = *(undefined4 *)&(this->opt).blob_allocator;
          uStack_4c = *(undefined4 *)((long)&(this->opt).blob_allocator + 4);
          local_48 = *(undefined4 *)&(this->opt).workspace_allocator;
          uStack_44 = *(undefined4 *)((long)&(this->opt).workspace_allocator + 4);
          uStack_40._0_1_ = (this->opt).use_winograd_convolution;
          uStack_40._1_1_ = (this->opt).use_sgemm_convolution;
          uStack_40._2_1_ = (this->opt).use_int8_inference;
          uStack_40._3_1_ = (this->opt).use_vulkan_compute;
          uStack_3c._0_1_ = (this->opt).use_fp16_packed;
          uStack_3c._1_1_ = (this->opt).use_fp16_storage;
          uStack_3c._2_1_ = (this->opt).use_fp16_arithmetic;
          uStack_3c._3_1_ = (this->opt).use_int8_storage;
          if (pLVar1->support_image_storage == false) {
            local_38._0_4_ = (uint)(uint3)local_38;
          }
          iVar4 = (*pLVar1->_vptr_Layer[4])(pLVar1,&local_58);
          bVar8 = iVar4 == 0;
          if (!bVar8) {
            load_model(this_00);
            iVar7 = -1;
          }
        }
        if (!bVar8) break;
        this_00 = (Net *)&(this_00->opt).field_0x1;
        ppLVar5 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (this_00 < (undefined1 *)
                         ((long)(this->layers).
                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppLVar5 >> 3));
    }
    ModelBin::~ModelBin(&MStack_68.super_ModelBin);
  }
  return iVar7;
}

Assistant:

Layer* Net::create_custom_layer(int index)
{
    const size_t custom_layer_registry_entry_count = custom_layer_registry.size();
    if (index < 0 || static_cast<unsigned int>(index) >= custom_layer_registry_entry_count)
        return 0;

    layer_creator_func layer_creator = custom_layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    return layer_creator();
}